

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void parallel_for_2d(thread_pool *thread_pool,_func_void_parallel_task_2d_ptr_size_t *compute,
                    parallel_task_2d *init,size_t task_size,range *range)

{
  work_item *pwVar1;
  size_t count;
  size_t task_count;
  work_item *tasks;
  ulong uVar2;
  ulong uVar3;
  work_item *pwVar4;
  work_item *pwVar5;
  work_item *first;
  work_item *last;
  work_item *last_00;
  work_item *pwVar6;
  work_item *pwVar7;
  work_item *pwVar8;
  
  count = thread_pool->thread_count;
  task_count = count * 2;
  tasks = (work_item *)xmalloc(task_count * task_size);
  init_parallel_tasks(tasks,&init->work_item,(_func_void_work_item_ptr_size_t *)compute,task_size,
                      task_count);
  pwVar7 = (work_item *)range->end;
  uVar2 = (long)pwVar7 - range->begin;
  last = (work_item *)0x0;
  pwVar6 = (work_item *)range[1].end;
  uVar3 = (long)pwVar6 - (long)range[1].begin;
  last_00 = tasks;
  first = tasks;
  pwVar8 = (work_item *)range[1].begin;
  do {
    if (pwVar6 <= pwVar8) {
      if (last != (work_item *)0x0) {
        last->next = (work_item *)0x0;
        submit_work(thread_pool,first,last);
      }
      wait_for_completion(thread_pool,0);
      free(tasks);
      return;
    }
    pwVar4 = (work_item *)
             (((uVar3 / task_count + 1) - (ulong)(uVar3 % task_count == 0)) + (long)pwVar8);
    if (pwVar4 < pwVar6) {
      pwVar6 = pwVar4;
    }
    pwVar5 = (work_item *)range->begin;
    while (pwVar5 < pwVar7) {
      if (last_00 == (work_item *)0x0) {
        __assert_fail("current_task",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0x132,
                      "void parallel_for_2d(struct thread_pool *, void (*)(struct parallel_task_2d *, size_t), struct parallel_task_2d *, size_t, const struct range *)"
                     );
      }
      pwVar1 = (work_item *)
               ((long)pwVar5 + ((uVar2 / task_count + 1) - (ulong)(uVar2 % task_count == 0)));
      if (pwVar1 < pwVar7) {
        pwVar7 = pwVar1;
      }
      last_00[1].work_fn = (work_fn_t)pwVar5;
      last_00[1].next = pwVar7;
      last_00[2].work_fn = (work_fn_t)pwVar8;
      last_00[2].next = pwVar6;
      last = last_00;
      pwVar7 = last_00->next;
      if (last_00->next == (work_item *)0x0) {
        submit_work(thread_pool,first,last_00);
        first = wait_for_completion(thread_pool,count);
        last = (work_item *)0x0;
        pwVar7 = first;
      }
      last_00 = pwVar7;
      pwVar5 = pwVar1;
      pwVar7 = (work_item *)range->end;
    }
    pwVar6 = (work_item *)range[1].end;
    pwVar8 = pwVar4;
  } while( true );
}

Assistant:

void parallel_for_2d(
    struct thread_pool* thread_pool,
    void (*compute)(struct parallel_task_2d*, size_t),
    struct parallel_task_2d* init, size_t task_size,
    const struct range* range)
{
    size_t thread_count = get_thread_count(thread_pool);
    size_t task_count = thread_count * 2;
    struct work_item* tasks = xmalloc(task_size * task_count);
    init_parallel_tasks(tasks, &init->work_item, (work_fn_t)compute, task_size, task_count);

    struct work_item* current_task  = tasks;
    struct work_item* first_task    = tasks;
    struct work_item* previous_task = NULL;

    const size_t chunk_size[] = {
        compute_chunk_size(range[0].end - range[0].begin, task_count),
        compute_chunk_size(range[1].end - range[1].begin, task_count)
    };
    for (size_t j = range[1].begin; j < range[1].end; j += chunk_size[1]) {
        size_t next_j = range_end(j, chunk_size[1], range[1].end);
        for (size_t i = range[0].begin; i < range[0].end; i += chunk_size[0]) {
            size_t next_i = range_end(i, chunk_size[0], range[0].end);
            assert(current_task);
            ((struct parallel_task_2d*)current_task)->range[0].begin = i;
            ((struct parallel_task_2d*)current_task)->range[0].end   = next_i;
            ((struct parallel_task_2d*)current_task)->range[1].begin = j;
            ((struct parallel_task_2d*)current_task)->range[1].end   = next_j;
            previous_task = current_task;
            current_task = current_task->next;
            if (!current_task) {
                submit_work(thread_pool, first_task, previous_task);
                first_task = current_task = wait_for_completion(thread_pool, thread_count);
                previous_task = NULL;
            }
        }
    }
    if (previous_task) {
        previous_task->next = NULL;
        submit_work(thread_pool, first_task, previous_task);
    }
    wait_for_completion(thread_pool, 0);
    free(tasks);
}